

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Value_Input.cxx
# Opt level: O0

void __thiscall Fl_Value_Input::draw(Fl_Value_Input *this)

{
  byte bVar1;
  Fl_Boxtype new_box;
  Fl_Color bg;
  Fl_Color sel;
  Fl_Widget *i;
  Fl_Value_Input *this_local;
  
  bVar1 = Fl_Widget::damage((Fl_Widget *)this);
  if ((bVar1 & 0xfe) != 0) {
    Fl_Widget::clear_damage((Fl_Widget *)&this->input,0x80);
  }
  new_box = Fl_Widget::box((Fl_Widget *)this);
  Fl_Widget::box((Fl_Widget *)&this->input,new_box);
  bg = Fl_Widget::color((Fl_Widget *)this);
  sel = Fl_Widget::selection_color((Fl_Widget *)this);
  Fl_Widget::color((Fl_Widget *)&this->input,bg,sel);
  (*(this->input).super_Fl_Input_.super_Fl_Widget._vptr_Fl_Widget[2])();
  Fl_Widget::clear_damage((Fl_Widget *)&this->input,'\0');
  return;
}

Assistant:

void Fl_Value_Input::draw() {
  if (damage()&~FL_DAMAGE_CHILD) input.clear_damage(FL_DAMAGE_ALL);
  input.box(box());
  input.color(color(), selection_color());
  Fl_Widget *i = &input; i->draw(); // calls protected input.draw()
  input.clear_damage();
}